

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_graph.cc
# Opt level: O3

int __thiscall InputGraph::degree(InputGraph *this,int a)

{
  _Head_base<0UL,_InputGraph::Imp_*,_false> _Var1;
  _Rb_tree_node_base *p_Var2;
  _Rb_tree_node_base *p_Var3;
  _Base_ptr p_Var4;
  int iVar5;
  bool bVar6;
  _Rb_tree_node_base *p_Var7;
  
  _Var1._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>._M_t.
       super__Tuple_impl<0UL,_InputGraph::Imp_*,_std::default_delete<InputGraph::Imp>_>.
       super__Head_base<0UL,_InputGraph::Imp_*,_false>._M_head_impl;
  p_Var3 = *(_Base_ptr *)((long)&(_Var1._M_head_impl)->edges + 0x10);
  iVar5 = 0;
  if (p_Var3 != (_Rb_tree_node_base *)0x0) {
    p_Var7 = (_Rb_tree_node_base *)((long)&(_Var1._M_head_impl)->edges + 8);
    p_Var2 = p_Var7;
    p_Var4 = p_Var3;
    do {
      bVar6 = *(int *)&p_Var4[1].field_0x4 < 0;
      if (p_Var4[1]._M_color != a) {
        bVar6 = (int)p_Var4[1]._M_color < a;
      }
      if (bVar6 == false) {
        p_Var2 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[bVar6];
    } while (p_Var4 != (_Base_ptr)0x0);
    do {
      if (a < (int)p_Var3[1]._M_color) {
        p_Var7 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color <= a];
    } while (p_Var3 != (_Base_ptr)0x0);
    iVar5 = 0;
    if (p_Var2 != p_Var7) {
      iVar5 = 0;
      do {
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
        iVar5 = iVar5 + 1;
      } while (p_Var2 != p_Var7);
    }
  }
  return iVar5;
}

Assistant:

auto InputGraph::has_vertex_labels() const -> bool
{
    return _imp->has_vertex_labels;
}